

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

vector<vera::Image,_std::allocator<vera::Image>_> *
vera::scaleSprite(vector<vera::Image,_std::allocator<vera::Image>_> *__return_storage_ptr__,
                 vector<vera::Image,_std::allocator<vera::Image>_> *_in,int _times)

{
  pointer ptVar1;
  int iVar2;
  size_type __new_size;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _func_int *p_Var6;
  ulong uVar7;
  ulong uVar8;
  thread *t_1;
  pointer ptVar9;
  value_type *__x;
  size_type sVar10;
  vector<vera::Image,_std::allocator<vera::Image>_> in_scaled;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Image last_layer;
  thread t;
  
  __new_size = ((long)(_in->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(_in->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0x70;
  in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vera::Image,_std::allocator<vera::Image>_>::resize(&in_scaled,__new_size);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = std::thread::hardware_concurrency();
  uVar3 = ((long)(_in->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(_in->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x70;
  uVar5 = (ulong)iVar2;
  uVar4 = uVar3 / uVar5;
  for (uVar8 = 0;
      ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,
      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start, uVar5 != uVar8; uVar8 = uVar8 + 1) {
    t._M_id._M_thread = (id)0;
    last_layer._vptr_Image = (_func_int **)operator_new(0x30);
    p_Var6 = (_func_int *)(uVar8 * uVar4);
    uVar7 = 0;
    if ((long)(iVar2 + -1) == uVar8) {
      uVar7 = uVar3 % uVar5;
    }
    *last_layer._vptr_Image = (_func_int *)&PTR___State_003de5d0;
    last_layer._vptr_Image[1] = (_func_int *)&in_scaled;
    last_layer._vptr_Image[2] = (_func_int *)_in;
    last_layer._vptr_Image[3] = p_Var6;
    last_layer._vptr_Image[4] = p_Var6 + uVar7 + uVar4;
    last_layer._vptr_Image[5] = (_func_int *)((long)_times * __new_size);
    std::thread::_M_start_thread(&t,&last_layer,0);
    if (last_layer._vptr_Image != (_func_int **)0x0) {
      (**(code **)(*last_layer._vptr_Image + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>(&threads,&t);
    std::thread::~thread(&t);
  }
  for (; ptVar9 != ptVar1; ptVar9 = ptVar9 + 1) {
    std::thread::join();
  }
  (__return_storage_ptr__->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Image::Image(&last_layer);
  for (sVar10 = 0; sVar10 != __new_size; sVar10 = sVar10 + 1) {
    __x = in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
          super__Vector_impl_data._M_start;
    if (sVar10 != 0) {
      for (iVar2 = 1; iVar2 < _times; iVar2 = iVar2 + 1) {
        fade((Image *)&t,&last_layer,
             in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
             super__Vector_impl_data._M_start + sVar10,(float)iVar2 / (float)_times);
        std::vector<vera::Image,_std::allocator<vera::Image>_>::emplace_back<vera::Image>
                  (__return_storage_ptr__,(Image *)&t);
        Image::~Image((Image *)&t);
      }
      __x = in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
            super__Vector_impl_data._M_start + sVar10;
    }
    std::vector<vera::Image,_std::allocator<vera::Image>_>::push_back(__return_storage_ptr__,__x);
    if (__new_size - 1 == sVar10) {
      for (iVar2 = 1; iVar2 < _times; iVar2 = iVar2 + 1) {
        std::vector<vera::Image,_std::allocator<vera::Image>_>::push_back
                  (__return_storage_ptr__,
                   in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
                   super__Vector_impl_data._M_start + (__new_size - 1));
      }
    }
    else {
      Image::operator=(&last_layer,
                       in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>.
                       _M_impl.super__Vector_impl_data._M_start + sVar10);
    }
  }
  Image::~Image(&last_layer);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  std::vector<vera::Image,_std::allocator<vera::Image>_>::~vector(&in_scaled);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image>  scaleSprite(const std::vector<Image>& _in, int _times) {
    size_t in_voxel_resolution = _in.size();
    size_t out_voxel_resolution = in_voxel_resolution * _times;
    std::vector<Image> in_scaled;
    in_scaled.resize(_in.size());

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t layersPerThread = _in.size() / nThreads;
    size_t layersLeftOver = _in.size() % nThreads;
    for (size_t i = 0; i < nThreads; ++i) {
        size_t start_layer = i * layersPerThread;
        size_t end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t( [&in_scaled, &_in, start_layer, end_layer, out_voxel_resolution]() {
            for (size_t z = start_layer; z < end_layer; z++) {
                in_scaled[z] = vera::scale(_in[z], out_voxel_resolution, out_voxel_resolution);
            }
        });

        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    std::vector<Image> out;
    vera::Image last_layer;
    for (int z = 0; z < in_voxel_resolution; z++) {
        if (z == 0)
            out.push_back( in_scaled[z] );
        else {
            for (int i = 1; i < _times; i++)
                out.push_back( vera::fade(last_layer, in_scaled[z], float(i) / float(_times)) );
            out.push_back( in_scaled[z] );
        }

        if ( z == in_voxel_resolution - 1) {
            for (int i = 1; i < _times; i++)
                out.push_back( in_scaled[z] );
        }
        else 
            last_layer = in_scaled[z];
    }

    return out;
}